

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall
ONX_ModelPrivate::CreateXMLFromRenderContent
          (ONX_ModelPrivate *this,ON_XMLNode *model_node,RenderContentKinds kind)

{
  ON_XMLNode *node;
  ON_ModelComponent *p;
  ON_RenderContent *rc;
  ON_RenderMaterial *pOVar1;
  ONX_ModelComponentIterator it;
  ONX_ModelComponentIterator local_70;
  
  node = GetRenderContentSectionNode(this,model_node,kind);
  if (node != (ON_XMLNode *)0x0) {
    (*node->_vptr_ON_XMLNode[0x12])(node);
    ONX_ModelComponentIterator::ONX_ModelComponentIterator(&local_70,this->m_model,RenderContent);
    p = ONX_ModelComponentIterator::FirstComponent(&local_70);
    while (p != (ON_ModelComponent *)0x0) {
      rc = ON_RenderContent::Cast(&p->super_ON_Object);
      if (rc != (ON_RenderContent *)0x0) {
        if (kind == Texture) {
          pOVar1 = (ON_RenderMaterial *)ON_RenderTexture::Cast((ON_Object *)rc);
        }
        else if (kind == Environment) {
          pOVar1 = (ON_RenderMaterial *)ON_RenderEnvironment::Cast((ON_Object *)rc);
        }
        else {
          if (kind != Material) goto LAB_0046e2d3;
          pOVar1 = ON_RenderMaterial::Cast((ON_Object *)rc);
        }
        if (pOVar1 != (ON_RenderMaterial *)0x0) {
          SetRenderContentNodeRecursive(rc,node);
        }
      }
LAB_0046e2d3:
      p = ONX_ModelComponentIterator::NextComponent(&local_70);
    }
    ON_ModelComponentWeakReference::~ON_ModelComponentWeakReference
              (&local_70.m_current_component_weak_ref);
  }
  return node != (ON_XMLNode *)0x0;
}

Assistant:

bool ONX_ModelPrivate::CreateXMLFromRenderContent(ON_XMLNode& model_node, RenderContentKinds kind) const
{
  ON_XMLNode* rc_section_node = GetRenderContentSectionNode(model_node, kind);
  if (nullptr == rc_section_node)
    return false;

  rc_section_node->RemoveAllChildren();

  ONX_ModelComponentIterator it(m_model, ON_ModelComponent::Type::RenderContent);
  const ON_ModelComponent* component = it.FirstComponent();
  while (nullptr != component)
  {
    const auto* rc = ON_RenderContent::Cast(component);
    if (nullptr != rc)
    {
      if (ContentIsKind(rc, kind))
      {
        SetRenderContentNodeRecursive(*rc, *rc_section_node);
      }
    }

    component = it.NextComponent();
  }

  return true;
}